

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  Message *pMVar1;
  wchar_t *in_RDX;
  string local_38;
  wchar_t *local_18;
  wchar_t *wide_c_str_local;
  Message *this_local;
  
  local_18 = wide_c_str;
  wide_c_str_local = (wchar_t *)this;
  internal::String::ShowWideCString_abi_cxx11_(&local_38,(String *)wide_c_str,in_RDX);
  pMVar1 = operator<<(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pMVar1;
}

Assistant:

Message& Message::operator<<(wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}